

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_reset(archive_acl *acl,wchar_t want_type)

{
  wchar_t wVar1;
  wchar_t in_ESI;
  archive_acl *in_RDI;
  wchar_t cutoff;
  wchar_t count;
  wchar_t local_14;
  
  wVar1 = archive_acl_count(in_RDI,in_ESI);
  if ((in_ESI & 0x100U) == 0) {
    local_14 = L'\0';
  }
  else {
    local_14 = L'\x03';
  }
  if (local_14 < wVar1) {
    in_RDI->acl_state = L'✒';
  }
  else {
    in_RDI->acl_state = L'\0';
  }
  in_RDI->acl_p = in_RDI->acl_head;
  return wVar1;
}

Assistant:

int
archive_acl_reset(struct archive_acl *acl, int want_type)
{
	int count, cutoff;

	count = archive_acl_count(acl, want_type);

	/*
	 * If the only entries are the three standard ones,
	 * then don't return any ACL data.  (In this case,
	 * client can just use chmod(2) to set permissions.)
	 */
	if ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)
		cutoff = 3;
	else
		cutoff = 0;

	if (count > cutoff)
		acl->acl_state = ARCHIVE_ENTRY_ACL_USER_OBJ;
	else
		acl->acl_state = 0;
	acl->acl_p = acl->acl_head;
	return (count);
}